

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

ParamGenerator<std::tuple<libaom_test::FuncParam<void_(*)(const_short_*,_int,_int,_int,_int_*,_long_*)>,_unsigned_char>_>
 __thiscall
testing::internal::CartesianProductHolder::operator_cast_to_ParamGenerator
          (CartesianProductHolder *this)

{
  CartesianProductGenerator<libaom_test::FuncParam<void_(*)(const_short_*,_int,_int,_int,_int_*,_long_*)>,_unsigned_char>
  *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  tuple<testing::internal::ParamGenerator<libaom_test::FuncParam<void_(*)(const_short_*,_int,_int,_int,_int_*,_long_*)>_>,_testing::internal::ParamGenerator<unsigned_char>_>
  *in_RSI;
  ParamGenerator<std::tuple<libaom_test::FuncParam<void_(*)(const_short_*,_int,_int,_int,_int_*,_long_*)>,_unsigned_char>_>
  PVar1;
  
  this_00 = (CartesianProductGenerator<libaom_test::FuncParam<void_(*)(const_short_*,_int,_int,_int,_int_*,_long_*)>,_unsigned_char>
             *)operator_new(0x28);
  CartesianProductGenerator<libaom_test::FuncParam<void_(*)(const_short_*,_int,_int,_int,_int_*,_long_*)>,_unsigned_char>
  ::CartesianProductGenerator(this_00,in_RSI);
  std::
  __shared_ptr<testing::internal::ParamGeneratorInterface<std::tuple<libaom_test::FuncParam<void(*)(short_const*,int,int,int,int*,long*)>,unsigned_char>>const,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<testing::internal::ParamGeneratorInterface<std::tuple<libaom_test::FuncParam<void(*)(short_const*,int,int,int,int*,long*)>,unsigned_char>>,void>
            ((__shared_ptr<testing::internal::ParamGeneratorInterface<std::tuple<libaom_test::FuncParam<void(*)(short_const*,int,int,int,int*,long*)>,unsigned_char>>const,(__gnu_cxx::_Lock_policy)2>
              *)this,(ParamGeneratorInterface<std::tuple<libaom_test::FuncParam<void_(*)(const_short_*,_int,_int,_int,_int_*,_long_*)>,_unsigned_char>_>
                      *)this_00);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<libaom_test::FuncParam<void_(*)(const_short_*,_int,_int,_int,_int_*,_long_*)>,_unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<libaom_test::FuncParam<void_(*)(const_short_*,_int,_int,_int,_int_*,_long_*)>,_unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<std::tuple<libaom_test::FuncParam<void_(*)(const_short_*,_int,_int,_int,_int_*,_long_*)>,_unsigned_char>_>
          )PVar1.impl_.
           super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<libaom_test::FuncParam<void_(*)(const_short_*,_int,_int,_int,_int_*,_long_*)>,_unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<::std::tuple<T...>>() const {
    return ParamGenerator<::std::tuple<T...>>(
        new CartesianProductGenerator<T...>(generators_));
  }